

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Pooling_x86::forward(Pooling_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*pauVar1) [16];
  size_t _elemsize;
  _func_int **pp_Var2;
  int i;
  int iVar3;
  uint _c;
  _func_int *p_Var4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint _c_00;
  undefined1 (*pauVar13) [16];
  int iVar14;
  int iVar15;
  int iVar16;
  Pooling *this_00;
  long lVar17;
  int k;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  float *pfVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  float fVar28;
  float fVar30;
  float fVar31;
  undefined1 auVar29 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int local_170;
  undefined1 (*local_168) [16];
  Mat m;
  Mat bottom_blob_bordered;
  Mat local_90;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  this_00 = (Pooling *)((long)&this->_vptr_Pooling_x86 + (long)this->_vptr_Pooling_x86[-3]);
  if ((*(int *)(&this->field_0x100 + (long)this->_vptr_Pooling_x86[-3]) != 0) ||
     (bottom_blob->elempack != 4)) {
    iVar3 = Pooling::forward(this_00,bottom_blob,top_blob,opt);
    return iVar3;
  }
  _c = bottom_blob->c;
  uVar5 = (ulong)_c;
  _elemsize = bottom_blob->elemsize;
  if (this_00->global_pooling != 0) {
    iVar3 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    Mat::create(top_blob,_c,_elemsize,4,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    iVar24 = iVar24 * iVar3;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86[-3]) == 1) {
      fVar33 = 1.0 / (float)iVar24;
      if (iVar24 < 1) {
        iVar24 = 0;
      }
      if ((int)_c < 1) {
        uVar5 = 0;
      }
      for (uVar26 = 0; uVar26 != uVar5; uVar26 = uVar26 + 1) {
        Mat::channel(&m,bottom_blob,(int)uVar26);
        pfVar22 = (float *)m.data;
        Mat::~Mat(&m);
        fVar28 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        iVar3 = iVar24;
        while (bVar27 = iVar3 != 0, iVar3 = iVar3 + -1, bVar27) {
          fVar28 = fVar28 + *pfVar22;
          fVar30 = fVar30 + pfVar22[1];
          fVar31 = fVar31 + pfVar22[2];
          fVar32 = fVar32 + pfVar22[3];
          pfVar22 = pfVar22 + 4;
        }
        pfVar22 = (float *)((long)top_blob->data + uVar26 * 0x10);
        *pfVar22 = fVar28 * fVar33;
        pfVar22[1] = fVar30 * fVar33;
        pfVar22[2] = fVar31 * fVar33;
        pfVar22[3] = fVar32 * fVar33;
      }
      return 0;
    }
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86[-3]) != 0) {
      return 0;
    }
    if (iVar24 < 1) {
      iVar24 = 0;
    }
    if ((int)_c < 1) {
      uVar5 = 0;
    }
    for (uVar26 = 0; uVar26 != uVar5; uVar26 = uVar26 + 1) {
      Mat::channel(&m,bottom_blob,(int)uVar26);
      pauVar13 = (undefined1 (*) [16])m.data;
      Mat::~Mat(&m);
      auVar29 = *pauVar13;
      iVar3 = iVar24;
      while (bVar27 = iVar3 != 0, iVar3 = iVar3 + -1, bVar27) {
        auVar29 = maxps(auVar29,*pauVar13);
        pauVar13 = pauVar13 + 1;
      }
      *(undefined1 (*) [16])((long)top_blob->data + uVar26 * 0x10) = auVar29;
    }
    return 0;
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered._20_8_ = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  Pooling::make_padding(this_00,bottom_blob,&bottom_blob_bordered,opt);
  iVar11 = bottom_blob_bordered.h;
  iVar24 = bottom_blob_bordered.w;
  iVar3 = -100;
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_001d6885;
  p_Var4 = this->_vptr_Pooling_x86[-3];
  iVar14 = (bottom_blob_bordered.w - *(int *)(&this->field_0xd4 + (long)p_Var4)) /
           *(int *)(&this->field_0xdc + (long)p_Var4);
  iVar8 = (bottom_blob_bordered.h - *(int *)(&this->field_0xd8 + (long)p_Var4)) /
          *(int *)(&this->field_0xe0 + (long)p_Var4);
  iVar15 = iVar14 + 1;
  Mat::create(top_blob,iVar15,iVar8 + 1,_c,_elemsize,4,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001d6885;
  uVar26 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86[-3]) *
           (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86[-3]);
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar26,(allocator_type *)&m);
  pp_Var2 = this->_vptr_Pooling_x86;
  p_Var4 = pp_Var2[-3];
  iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar16 = 0;
  lVar17 = 0;
  for (iVar18 = 0; iVar12 = *(int *)(&this->field_0xd8 + (long)p_Var4), iVar18 < iVar12;
      iVar18 = iVar18 + 1) {
    for (lVar20 = 0; iVar12 = (int)lVar20, iVar12 < *(int *)(&this->field_0xd4 + (long)p_Var4);
        lVar20 = lVar20 + 1) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar17 + lVar20] = iVar16 + iVar12;
      p_Var4 = pp_Var2[-3];
    }
    iVar16 = iVar16 + (iVar24 - iVar3) + iVar12;
    lVar17 = (int)lVar17 + lVar20;
  }
  iVar3 = (int)uVar26;
  if (*(int *)(&this->field_0xd0 + (long)p_Var4) == 0) {
    if (iVar12 == 2 && *(int *)(&this->field_0xd4 + (long)p_Var4) == 2) {
      if ((*(int *)(&this->field_0xdc + (long)p_Var4) == 2) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var4) == 2)) {
        iVar3 = top_blob->w;
        iVar24 = bottom_blob_bordered.w - iVar3;
        iVar11 = 0;
        if (iVar3 < 1) {
          iVar3 = iVar11;
        }
        iVar8 = top_blob->h;
        if (top_blob->h < 1) {
          iVar8 = iVar11;
        }
        iVar14 = bottom_blob_bordered.c;
        if (bottom_blob_bordered.c < 1) {
          iVar14 = iVar11;
        }
        for (; iVar11 != iVar14; iVar11 = iVar11 + 1) {
          Mat::channel(&m,&bottom_blob_bordered,iVar11);
          Mat::channel(&local_90,top_blob,iVar11);
          pauVar13 = (undefined1 (*) [16])local_90.data;
          Mat::~Mat(&local_90);
          pvVar9 = (void *)((long)m.w * m.elemsize + (long)m.data);
          pvVar6 = m.data;
          for (iVar15 = 0; iVar15 != iVar8; iVar15 = iVar15 + 1) {
            lVar20 = 0;
            lVar17 = (long)(iVar24 * 8) * -4;
            iVar16 = iVar3;
            while (bVar27 = iVar16 != 0, iVar16 = iVar16 + -1, bVar27) {
              auVar29 = maxps(*(undefined1 (*) [16])((long)pvVar6 + lVar20 * 2 + 0x10),
                              *(undefined1 (*) [16])((long)pvVar6 + lVar20 * 2));
              auVar34 = maxps(*(undefined1 (*) [16])((long)pvVar9 + lVar20 * 2 + 0x10),
                              *(undefined1 (*) [16])((long)pvVar9 + lVar20 * 2));
              auVar29 = maxps(auVar34,auVar29);
              *(undefined1 (*) [16])(*pauVar13 + lVar20) = auVar29;
              lVar17 = lVar17 + -0x20;
              lVar20 = lVar20 + 0x10;
            }
            pvVar6 = (void *)((long)pvVar6 - lVar17);
            pvVar9 = (void *)((long)pvVar9 - lVar17);
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + lVar20);
          }
          Mat::~Mat(&m);
        }
      }
      else {
LAB_001d64f9:
        uVar19 = 0;
        uVar26 = uVar26 & 0xffffffff;
        if (iVar3 < 1) {
          uVar26 = uVar19;
        }
        if ((int)_c < 1) {
          uVar5 = uVar19;
        }
        while( true ) {
          local_170 = (int)uVar5;
          iVar3 = (int)uVar19;
          if (iVar3 == local_170) break;
          Mat::channel(&m,&bottom_blob_bordered,iVar3);
          Mat::channel(&local_90,top_blob,iVar3);
          pauVar13 = (undefined1 (*) [16])local_90.data;
          Mat::~Mat(&local_90);
          for (iVar24 = 0; iVar24 <= iVar8; iVar24 = iVar24 + 1) {
            pp_Var2 = this->_vptr_Pooling_x86;
            for (lVar17 = 0; lVar17 <= iVar14; lVar17 = lVar17 + 1) {
              pauVar1 = (undefined1 (*) [16])
                        ((long)m.data +
                        (long)(*(int *)(&this->field_0xdc + (long)pp_Var2[-3]) * (int)lVar17 * 4) *
                        4 + (long)m.w * (long)iVar24 *
                            (long)*(int *)(&this->field_0xe0 + (long)pp_Var2[-3]) * m.elemsize);
              auVar29 = *pauVar1;
              for (uVar19 = 0; uVar26 != uVar19; uVar19 = uVar19 + 1) {
                auVar29 = maxps(auVar29,pauVar1[_space_ofs.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar19]]);
              }
              pauVar13[lVar17] = auVar29;
            }
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + (long)(iVar15 * 4) * 4);
          }
          Mat::~Mat(&m);
          uVar19 = (ulong)(iVar3 + 1);
        }
      }
    }
    else {
      if (((iVar12 != 3 || *(int *)(&this->field_0xd4 + (long)p_Var4) != 3) ||
          (*(int *)(&this->field_0xdc + (long)p_Var4) != 2)) ||
         (*(int *)(&this->field_0xe0 + (long)p_Var4) != 2)) goto LAB_001d64f9;
      iVar3 = top_blob->w;
      iVar11 = 0;
      iVar24 = top_blob->h;
      if (top_blob->h < 1) {
        iVar24 = iVar11;
      }
      iVar8 = bottom_blob_bordered.c;
      if (bottom_blob_bordered.c < 1) {
        iVar8 = iVar11;
      }
      lVar17 = (long)((bottom_blob_bordered.w - iVar3) * 8) * 4;
      for (; iVar11 != iVar8; iVar11 = iVar11 + 1) {
        Mat::channel(&m,&bottom_blob_bordered,iVar11);
        Mat::channel(&local_90,top_blob,iVar11);
        pauVar13 = (undefined1 (*) [16])local_90.data;
        Mat::~Mat(&local_90);
        pvVar6 = (void *)((long)m.data + (long)m.w * m.elemsize);
        pvVar9 = (void *)((long)m.data + (long)m.w * m.elemsize * 2);
        pvVar7 = m.data;
        for (iVar14 = 0; iVar14 != iVar24; iVar14 = iVar14 + 1) {
          lVar20 = 0;
          for (iVar15 = 0; iVar15 + 1 < iVar3; iVar15 = iVar15 + 2) {
            auVar35 = maxps(*(undefined1 (*) [16])((long)pvVar7 + lVar20 + 0x10),
                            *(undefined1 (*) [16])((long)pvVar7 + lVar20));
            auVar29 = *(undefined1 (*) [16])((long)pvVar7 + lVar20 + 0x20);
            auVar34 = *(undefined1 (*) [16])((long)pvVar6 + lVar20 + 0x20);
            auVar40 = *(undefined1 (*) [16])((long)pvVar6 + lVar20 + 0x30);
            auVar37 = maxps(*(undefined1 (*) [16])((long)pvVar6 + lVar20),auVar29);
            auVar35 = maxps(auVar37,auVar35);
            auVar38 = maxps(auVar35,*(undefined1 (*) [16])((long)pvVar6 + lVar20 + 0x10));
            auVar35 = *(undefined1 (*) [16])((long)pvVar9 + lVar20 + 0x20);
            auVar37 = *(undefined1 (*) [16])((long)pvVar9 + lVar20 + 0x30);
            auVar36 = maxps(*(undefined1 (*) [16])((long)pvVar9 + lVar20),auVar34);
            auVar39 = maxps(*(undefined1 (*) [16])((long)pvVar9 + lVar20 + 0x10),auVar35);
            auVar36 = maxps(auVar39,auVar36);
            auVar39 = maxps(auVar36,auVar38);
            auVar36 = maxps(*(undefined1 (*) [16])((long)pvVar7 + lVar20 + 0x40),
                            *(undefined1 (*) [16])((long)pvVar7 + lVar20 + 0x30));
            auVar38 = maxps(*(undefined1 (*) [16])((long)pvVar9 + lVar20 + 0x40),
                            *(undefined1 (*) [16])((long)pvVar6 + lVar20 + 0x40));
            *pauVar13 = auVar39;
            auVar29 = maxps(auVar40,auVar29);
            auVar29 = maxps(auVar29,auVar36);
            auVar40 = maxps(auVar37,auVar34);
            auVar34 = maxps(auVar38,auVar35);
            auVar29 = maxps(auVar34,auVar29);
            auVar29 = maxps(auVar29,auVar40);
            pauVar13[1] = auVar29;
            pauVar13 = pauVar13 + 2;
            lVar20 = lVar20 + 0x40;
          }
          for (; iVar15 < iVar3; iVar15 = iVar15 + 1) {
            auVar29 = maxps(*(undefined1 (*) [16])((long)pvVar7 + lVar20 + 0x10),
                            *(undefined1 (*) [16])((long)pvVar7 + lVar20));
            auVar34 = maxps(*(undefined1 (*) [16])((long)pvVar6 + lVar20),
                            *(undefined1 (*) [16])((long)pvVar7 + lVar20 + 0x20));
            auVar29 = maxps(auVar34,auVar29);
            auVar29 = maxps(*(undefined1 (*) [16])((long)pvVar6 + lVar20 + 0x10),auVar29);
            auVar34 = maxps(*(undefined1 (*) [16])((long)pvVar9 + lVar20),
                            *(undefined1 (*) [16])((long)pvVar6 + lVar20 + 0x20));
            auVar40 = maxps(*(undefined1 (*) [16])((long)pvVar9 + lVar20 + 0x20),
                            *(undefined1 (*) [16])((long)pvVar9 + lVar20 + 0x10));
            auVar34 = maxps(auVar40,auVar34);
            auVar29 = maxps(auVar34,auVar29);
            *pauVar13 = auVar29;
            pauVar13 = pauVar13 + 1;
            lVar20 = lVar20 + 0x20;
          }
          pvVar7 = (void *)((long)pvVar7 + lVar20 + lVar17);
          pvVar6 = (void *)((long)pvVar6 + lVar20 + lVar17);
          pvVar9 = (void *)((long)pvVar9 + lVar20 + lVar17);
        }
        Mat::~Mat(&m);
      }
    }
  }
  else if (*(int *)(&this->field_0xd0 + (long)p_Var4) == 1) {
    if (*(int *)(&this->field_0xfc + (long)p_Var4) == 0) {
      iVar16 = 0;
      iVar3 = 0;
      if (*(int *)(&this->field_0xf8 + (long)p_Var4) == 0) {
        iVar16 = (bottom_blob->w - bottom_blob_bordered.w) +
                 *(int *)(&this->field_0xe4 + (long)p_Var4) +
                 *(int *)(&this->field_0xe8 + (long)p_Var4);
        iVar3 = (bottom_blob->h - bottom_blob_bordered.h) +
                *(int *)(&this->field_0xec + (long)p_Var4) +
                *(int *)(&this->field_0xf0 + (long)p_Var4);
      }
      if ((int)_c < 1) {
        _c = 0;
      }
      for (_c_00 = 0; _c_00 != _c; _c_00 = _c_00 + 1) {
        Mat::channel(&m,&bottom_blob_bordered,_c_00);
        Mat::channel(&local_90,top_blob,_c_00);
        local_168 = (undefined1 (*) [16])local_90.data;
        Mat::~Mat(&local_90);
        pp_Var2 = this->_vptr_Pooling_x86;
        for (iVar18 = 0; iVar18 <= iVar8; iVar18 = iVar18 + 1) {
          lVar17 = (long)(*(int *)(&this->field_0xe0 + (long)pp_Var2[-3]) * iVar18);
          for (lVar20 = 0; lVar20 <= iVar14; lVar20 = lVar20 + 1) {
            p_Var4 = pp_Var2[-3];
            uVar26 = 0;
            uVar5 = (ulong)*(uint *)(&this->field_0xd8 + (long)p_Var4);
            if ((int)*(uint *)(&this->field_0xd8 + (long)p_Var4) < 1) {
              uVar5 = uVar26;
            }
            lVar23 = (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)lVar20);
            lVar21 = lVar23 * 0x10 + (long)m.w * m.elemsize * lVar17 + (long)m.data;
            fVar33 = 0.0;
            fVar28 = 0.0;
            fVar30 = 0.0;
            fVar31 = 0.0;
            iVar12 = 0;
            for (; uVar26 != uVar5; uVar26 = uVar26 + 1) {
              lVar10 = uVar26 + lVar17;
              if (*(int *)(&this->field_0xec + (long)p_Var4) <= lVar10) {
                if ((iVar3 + iVar11) - *(int *)(&this->field_0xf0 + (long)p_Var4) <= lVar10) break;
                uVar19 = (ulong)*(uint *)(&this->field_0xd4 + (long)p_Var4);
                if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                  uVar19 = 0;
                }
                lVar10 = lVar23;
                for (lVar25 = 0; uVar19 * 0x10 != lVar25; lVar25 = lVar25 + 0x10) {
                  if (*(int *)(&this->field_0xe4 + (long)p_Var4) <= lVar10) {
                    if ((iVar16 + iVar24) - *(int *)(&this->field_0xe8 + (long)p_Var4) <= lVar10)
                    break;
                    auVar29 = *(undefined1 (*) [16])(lVar21 + lVar25);
                    fVar33 = fVar33 + auVar29._0_4_;
                    fVar28 = fVar28 + auVar29._4_4_;
                    fVar30 = fVar30 + auVar29._8_4_;
                    fVar31 = fVar31 + auVar29._12_4_;
                    iVar12 = iVar12 + 1;
                  }
                  lVar10 = lVar10 + 1;
                }
              }
              lVar21 = lVar21 + (long)m.w * m.elemsize;
            }
            fVar32 = 1.0 / (float)iVar12;
            auVar29._0_4_ = fVar32 * fVar33;
            auVar29._4_4_ = fVar32 * fVar28;
            auVar29._8_4_ = fVar32 * fVar30;
            auVar29._12_4_ = fVar32 * fVar31;
            local_168[lVar20] = auVar29;
          }
          local_168 = (undefined1 (*) [16])(*local_168 + (long)(iVar15 * 4) * 4);
        }
        Mat::~Mat(&m);
      }
    }
    else {
      fVar33 = 1.0 / (float)iVar3;
      uVar19 = 0;
      uVar26 = uVar26 & 0xffffffff;
      if (iVar3 < 1) {
        uVar26 = uVar19;
      }
      if ((int)_c < 1) {
        uVar5 = uVar19;
      }
      while( true ) {
        local_170 = (int)uVar5;
        iVar3 = (int)uVar19;
        if (iVar3 == local_170) break;
        Mat::channel(&m,&bottom_blob_bordered,iVar3);
        Mat::channel(&local_90,top_blob,iVar3);
        pauVar13 = (undefined1 (*) [16])local_90.data;
        Mat::~Mat(&local_90);
        for (iVar24 = 0; iVar24 <= iVar8; iVar24 = iVar24 + 1) {
          pp_Var2 = this->_vptr_Pooling_x86;
          for (lVar17 = 0; lVar17 <= iVar14; lVar17 = lVar17 + 1) {
            fVar28 = 0.0;
            fVar30 = 0.0;
            fVar31 = 0.0;
            fVar32 = 0.0;
            for (uVar19 = 0; uVar26 != uVar19; uVar19 = uVar19 + 1) {
              pfVar22 = (float *)((long)m.data +
                                 (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar19] * 0x10 +
                                 (long)(*(int *)(&this->field_0xdc + (long)pp_Var2[-3]) *
                                        (int)lVar17 * 4) * 4 +
                                 (long)m.w * (long)iVar24 *
                                 (long)*(int *)(&this->field_0xe0 + (long)pp_Var2[-3]) * m.elemsize)
              ;
              fVar28 = fVar28 + *pfVar22;
              fVar30 = fVar30 + pfVar22[1];
              fVar31 = fVar31 + pfVar22[2];
              fVar32 = fVar32 + pfVar22[3];
            }
            pauVar1 = pauVar13 + lVar17;
            *(float *)*pauVar1 = fVar28 * fVar33;
            *(float *)(*pauVar1 + 4) = fVar30 * fVar33;
            *(float *)(*pauVar1 + 8) = fVar31 * fVar33;
            *(float *)(*pauVar1 + 0xc) = fVar32 * fVar33;
          }
          pauVar13 = (undefined1 (*) [16])(*pauVar13 + (long)(iVar15 * 4) * 4);
        }
        Mat::~Mat(&m);
        uVar19 = (ulong)(iVar3 + 1);
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  iVar3 = 0;
LAB_001d6885:
  Mat::~Mat(&bottom_blob_bordered);
  return iVar3;
}

Assistant:

int Pooling_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}